

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curramt.cpp
# Opt level: O0

int __thiscall
icu_63::CurrencyAmount::clone
          (CurrencyAmount *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  CurrencyAmount *this_00;
  undefined8 local_30;
  CurrencyAmount *this_local;
  
  this_00 = (CurrencyAmount *)UMemory::operator_new((UMemory *)0x80,(size_t)__fn);
  local_30 = (CurrencyAmount *)0x0;
  if (this_00 != (CurrencyAmount *)0x0) {
    CurrencyAmount(this_00,this);
    local_30 = this_00;
  }
  return (int)local_30;
}

Assistant:

UObject* CurrencyAmount::clone() const {
    return new CurrencyAmount(*this);
}